

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH32_hash_t XXH32_digest(XXH32_state_t *state)

{
  undefined1 auVar1 [16];
  xxh_u32 xVar2;
  XXH_alignment in_ECX;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  long lVar8;
  
  if (state->large_len == 0) {
    iVar3 = state->v[2] + 0x165667b1;
  }
  else {
    auVar1 = *(undefined1 (*) [16])state->v;
    lVar4 = (ulong)auVar1._0_4_ * 2;
    lVar5 = (auVar1._8_8_ & 0xffffffff) * 0x1000;
    auVar7._8_4_ = 0x40000;
    auVar7._0_8_ = 0x8000000080;
    auVar7._12_4_ = 0x40000;
    lVar6 = (ulong)auVar1._4_4_ * 0x80;
    lVar8 = (auVar7._8_8_ & 0xffffffff) * (ulong)auVar1._12_4_;
    iVar3 = ((uint)lVar8 | (uint)((ulong)lVar8 >> 0x20)) +
            ((uint)lVar6 | (uint)((ulong)lVar6 >> 0x20)) +
            ((uint)lVar5 | (uint)((ulong)lVar5 >> 0x20)) +
            ((uint)lVar4 | (uint)((ulong)lVar4 >> 0x20));
  }
  xVar2 = XXH32_finalize(iVar3 + state->total_len_32,(xxh_u8 *)state->mem32,(ulong)state->memsize,
                         in_ECX);
  return xVar2;
}

Assistant:

XXH_PUBLIC_API XXH32_hash_t XXH32_digest(const XXH32_state_t* state)
{
    xxh_u32 h32;

    if (state->large_len) {
        h32 = XXH_rotl32(state->v[0], 1)
            + XXH_rotl32(state->v[1], 7)
            + XXH_rotl32(state->v[2], 12)
            + XXH_rotl32(state->v[3], 18);
    } else {
        h32 = state->v[2] /* == seed */ + XXH_PRIME32_5;
    }

    h32 += state->total_len_32;

    return XXH32_finalize(h32, (const xxh_u8*)state->mem32, state->memsize, XXH_aligned);
}